

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonEx(char *label,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  bool bVar1;
  byte bVar2;
  ImU32 IVar3;
  ImGuiWindow *pIVar4;
  uint in_EDX;
  ImVec2 *in_RSI;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  ImVec2 pos;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff40;
  ImVec2 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  ImGuiID in_stack_ffffffffffffff54;
  ImRect *bb_00;
  undefined8 in_stack_ffffffffffffff68;
  ImGuiButtonFlags flags_00;
  bool *in_stack_ffffffffffffff70;
  bool *in_stack_ffffffffffffff78;
  ImVec2 *pos_max;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  float rounding;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  ImVec2 in_stack_ffffffffffffff98;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImGuiID local_3c;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  flags_00 = (ImGuiButtonFlags)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  pIVar4 = GetCurrentWindow();
  if ((pIVar4->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    bb_00 = (ImRect *)0x0;
    local_3c = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                  (char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    local_44 = CalcTextSize((char *)bb_00,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48.y._3_1_,in_stack_ffffffffffffff48.x);
    local_4c = (pIVar4->DC).CursorPos;
    if (((in_EDX & 0x800) != 0) &&
       ((local_38->FramePadding).y < (pIVar4->DC).CurrLineTextBaseOffset)) {
      local_4c.y = ((pIVar4->DC).CurrLineTextBaseOffset - (local_38->FramePadding).y) + local_4c.y;
    }
    IVar6 = *in_RSI;
    CalcItemSize(in_stack_ffffffffffffff48,(float)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                 SUB84(in_stack_ffffffffffffff40,0));
    IVar5 = ::operator+(in_stack_ffffffffffffff28,(ImVec2 *)0x230da4);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff90,&local_4c,(ImVec2 *)&stack0xffffffffffffff88);
    ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48.y);
    bVar1 = ItemAdd(bb_00,in_stack_ffffffffffffff54,(ImRect *)in_stack_ffffffffffffff48);
    if (bVar1) {
      if (((pIVar4->DC).ItemFlags & 2U) != 0) {
        in_EDX = in_EDX | 1;
      }
      bVar2 = ButtonBehavior((ImRect *)IVar5,
                             CONCAT13(in_stack_ffffffffffffff87,
                                      CONCAT12(in_stack_ffffffffffffff86,
                                               CONCAT11(in_stack_ffffffffffffff85,
                                                        in_stack_ffffffffffffff84))),
                             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,flags_00);
      rounding = IVar5.y;
      IVar3 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                          SUB84(in_stack_ffffffffffffff40,0));
      RenderNavHighlight((ImRect *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                         (ImGuiID)((ulong)pIVar4 >> 0x20),(ImGuiNavHighlightFlags)pIVar4);
      pos_max = (ImVec2 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
      RenderFrame(IVar6,in_stack_ffffffffffffff98,(ImU32)in_stack_ffffffffffffff94,
                  SUB41((uint)in_stack_ffffffffffffff90 >> 0x18,0),rounding);
      IVar6 = ::operator+(in_stack_ffffffffffffff28,(ImVec2 *)0x230f10);
      IVar5 = ::operator-(in_stack_ffffffffffffff28,(ImVec2 *)0x230f2c);
      RenderTextClipped((ImVec2 *)
                        CONCAT17(in_stack_ffffffffffffff87,
                                 CONCAT16(in_stack_ffffffffffffff86,
                                          CONCAT15(bVar2,CONCAT14(in_stack_ffffffffffffff84,IVar3)))
                                ),pos_max,(char *)in_stack_ffffffffffffff98,(char *)IVar6,
                        (ImVec2 *)IVar5,&bb_00->Min,
                        (ImRect *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_1 = (bool)(bVar2 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ButtonEx(const char* label, const ImVec2& size_arg, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    ImVec2 pos = window->DC.CursorPos;
    if ((flags & ImGuiButtonFlags_AlignTextBaseLine) && style.FramePadding.y < window->DC.CurrLineTextBaseOffset) // Try to vertically align buttons that are smaller/have no padding so that text baseline matches (bit hacky, since it shouldn't be a flag)
        pos.y += window->DC.CurrLineTextBaseOffset - style.FramePadding.y;
    ImVec2 size = CalcItemSize(size_arg, label_size.x + style.FramePadding.x * 2.0f, label_size.y + style.FramePadding.y * 2.0f);

    const ImRect bb(pos, pos + size);
    ItemSize(size, style.FramePadding.y);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, style.FrameRounding);
    RenderTextClipped(bb.Min + style.FramePadding, bb.Max - style.FramePadding, label, NULL, &label_size, style.ButtonTextAlign, &bb);

    // Automatically close popups
    //if (pressed && !(flags & ImGuiButtonFlags_DontClosePopups) && (window->Flags & ImGuiWindowFlags_Popup))
    //    CloseCurrentPopup();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    return pressed;
}